

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::HardenedPrintString
          (Printer *this,string_view src,BaseTextGenerator *generator)

{
  Printer *pPVar1;
  byte bVar2;
  size_type sVar3;
  long *plVar4;
  Printer *pPVar5;
  Printer *pPVar6;
  Printer *__pos;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  string_view src_local;
  basic_string_view<char,_std::char_traits<char>_> local_50 [2];
  
  plVar4 = (long *)src._M_str;
  pcVar7 = (char *)src._M_len;
  src_local._M_len = (size_t)this;
  src_local._M_str = pcVar7;
  (**(code **)(*plVar4 + 0x28))(plVar4,"\"",1);
  while (this != (Printer *)0x0) {
    local_50[0]._M_len = (size_t)this;
    local_50[0]._M_str = pcVar7;
    for (__pos = (Printer *)0x0; pPVar5 = this, __pos < this;
        __pos = (Printer *)((long)&__pos->initial_indent_level_ + 1)) {
      bVar2 = local_50[0]._M_str[(long)__pos];
      pPVar5 = __pos;
      if ((char)bVar2 < '\0') {
        do {
          pPVar1 = (Printer *)((long)&pPVar5->initial_indent_level_ + 1);
          pPVar6 = this;
          if (this <= pPVar1) break;
          pcVar7 = local_50[0]._M_str + 1 + (long)pPVar5;
          pPVar5 = pPVar1;
          pPVar6 = pPVar1;
        } while (*pcVar7 < '\0');
        bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (local_50,(size_type)__pos,(long)pPVar6 - (long)__pos);
        sVar3 = utf8_range::SpanStructurallyValid(bVar8._M_len);
        if (sVar3 != (long)pPVar6 - (long)__pos) {
          pPVar5 = (Printer *)((long)&__pos->initial_indent_level_ + sVar3);
          break;
        }
        __pos = (Printer *)((long)&pPVar6[-1].finder_ + 7);
        this = (Printer *)local_50[0]._M_len;
      }
      else if ((0x5e < (byte)(bVar2 - 0x20)) ||
              ((bVar2 - 0x22 < 0x3b &&
               ((0x400000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)))) break;
    }
    if (pPVar5 != (Printer *)0x0) {
      bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&src_local,0,(size_type)pPVar5);
      (**(code **)(*plVar4 + 0x28))(plVar4,bVar8._M_str,bVar8._M_len);
      src_local._M_str = src_local._M_str + (long)pPVar5;
      src_local._M_len = src_local._M_len - (long)pPVar5;
      if (src_local._M_len == 0) break;
    }
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&src_local,0,1);
    absl::lts_20240722::CEscape_abi_cxx11_(local_50,bVar8._M_len,bVar8._M_str);
    (**(code **)(*plVar4 + 0x28))(plVar4,local_50[0]._M_len,local_50[0]._M_str);
    std::__cxx11::string::~string((string *)local_50);
    pcVar7 = src_local._M_str + 1;
    this = (Printer *)(src_local._M_len - 1);
    src_local._M_len = (size_t)this;
    src_local._M_str = pcVar7;
  }
  (**(code **)(*plVar4 + 0x28))(plVar4,"\"",1);
  return;
}

Assistant:

void TextFormat::Printer::HardenedPrintString(
    absl::string_view src, TextFormat::BaseTextGenerator* generator) {
  // Print as UTF-8, while guarding against any invalid UTF-8 in the string
  // field.
  //
  // If in the future we have a guaranteed invariant that invalid UTF-8 will
  // never be present, we could avoid the UTF-8 check here.

  generator->PrintLiteral("\"");
  while (!src.empty()) {
    size_t n = SkipPassthroughBytes(src);
    if (n != 0) {
      generator->PrintString(src.substr(0, n));
      src.remove_prefix(n);
      if (src.empty()) break;
    }

    // If repeated calls to CEscape() and PrintString() are expensive, we could
    // consider batching them, at the cost of some complexity.
    generator->PrintString(absl::CEscape(src.substr(0, 1)));
    src.remove_prefix(1);
  }
  generator->PrintLiteral("\"");
}